

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Script *script,
          string *bech32_hrp)

{
  ulong uVar1;
  NetType_conflict local_6c;
  AddressType local_5c;
  CfdSourceLocation local_58;
  allocator local_29;
  string *local_28;
  string *bech32_hrp_local;
  Script *script_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_28 = bech32_hrp;
  bech32_hrp_local = (string *)script;
  script_local._0_4_ = witness_ver;
  script_local._4_4_ = type;
  _witness_ver_local = this;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_6c = kCfdConnectionError;
  }
  else {
    local_6c = script_local._4_4_;
  }
  this->type_ = local_6c;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = (WitnessVersion)script_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,(Script *)bech32_hrp_local);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateP2WSH(this,local_28);
  local_58.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_58.filename = local_58.filename + 1;
  local_58.line = 0x1eb;
  local_58.funcname = "Address";
  local_5c = kP2wshAddress;
  logger::info<cfd::core::NetType&,cfd::core::AddressType,std::__cxx11::string_const&>
            (&local_58,"call Address({},{},{})",&this->type_,&local_5c,local_28);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Script& script,
    const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script) {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateP2WSH(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2wshAddress, bech32_hrp);
}